

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::throwStatement(Parser *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  shared_ptr<Expression> local_58;
  undefined1 local_48 [40];
  ptr<Expression> toThrow;
  Parser *this_local;
  
  consume(in_RSI);
  std::shared_ptr<Expression>::shared_ptr((shared_ptr<Expression> *)(local_48 + 0x20));
  bVar1 = match(in_RSI,StatEnd);
  if (!bVar1) {
    expression((Parser *)local_48);
    std::shared_ptr<Expression>::operator=
              ((shared_ptr<Expression> *)(local_48 + 0x20),(shared_ptr<Expression> *)local_48);
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_48);
  }
  consume(in_RSI,StatEnd,"\';\'");
  make<ThrowStatement,std::shared_ptr<Expression>&>(&local_58);
  std::shared_ptr<Statement>::shared_ptr<ThrowStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<ThrowStatement> *)&local_58);
  std::shared_ptr<ThrowStatement>::~shared_ptr((shared_ptr<ThrowStatement> *)&local_58);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)(local_48 + 0x20));
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::throwStatement() {
    consume();
    ptr<Expression> toThrow;

    if(!match(TokenType::StatEnd)) {
        toThrow = expression();
    }
    consume(TokenType::StatEnd, "';'");
    return make<ThrowStatement>(toThrow);
}